

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O2

Rectangle * __thiscall
pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
          (World *this,Vector3 *args,Vector3 *args_1,Vector3 *args_2,Vector3 *args_3)

{
  pointer *__ptr;
  _Head_base<0UL,_pm::Geometry_*,_false> local_28;
  Geometry *local_20;
  
  std::make_unique<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
            ((Vector3 *)&local_20,args,args_1,args_2);
  local_28._M_head_impl = local_20;
  local_20 = (Geometry *)0x0;
  std::
  vector<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>,std::allocator<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>>>
  ::emplace_back<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>>
            ((vector<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>,std::allocator<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>>>
              *)&this->objects_,
             (unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_28);
  if (local_28._M_head_impl != (Geometry *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Geometry[1])();
  }
  local_28._M_head_impl = (Geometry *)0x0;
  if (local_20 != (Geometry *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (Rectangle *)
         (this->objects_).
         super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<pm::Geometry,_std::default_delete<pm::Geometry>_>._M_t.
         super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
         super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl;
}

Assistant:

T *createObject(Args &&... args)
	{
		objects_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
		return static_cast<T *>(objects_.back().get());
	}